

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O1

void __thiscall tt::detail::ThreadData::runInThread(ThreadData *this)

{
  char *pcVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  
  if (*(int *)(in_FS_OFFSET + -0x30) == 0) {
    CurrentThread::cacheTid();
  }
  *this->m_tid = *(pid_t *)(in_FS_OFFSET + -0x30);
  this->m_tid = (pid_t *)0x0;
  CountDownLatch::countDown(this->m_latch);
  this->m_latch = (CountDownLatch *)0x0;
  if ((this->m_name)._M_string_length == 0) {
    pcVar1 = "tt_Thread";
  }
  else {
    pcVar1 = (this->m_name)._M_dataplus._M_p;
  }
  *(char **)(in_FS_OFFSET + -0x38) = pcVar1;
  puVar2 = (undefined8 *)&DAT_0000000f;
  prctl(0xf);
  if ((this->m_func).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_func)._M_invoker)((_Any_data *)this);
    *(char **)(in_FS_OFFSET + -0x38) = "finish";
    return;
  }
  std::__throw_bad_function_call();
  puVar2[2] = 0;
  puVar2[3] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  if (*(code **)(pcVar1 + 0x10) != (code *)0x0) {
    (**(code **)(pcVar1 + 0x10))();
    puVar2[3] = *(undefined8 *)(pcVar1 + 0x18);
    puVar2[2] = *(undefined8 *)(pcVar1 + 0x10);
  }
  return;
}

Assistant:

void runInThread(){
			*m_tid = tt::CurrentThread::tid();
			m_tid = NULL;
			m_latch->countDown();
			m_latch = NULL;
			
			tt::CurrentThread::t_threadName = m_name.empty() ? "tt_Thread" : m_name.c_str();

			::prctl(PR_SET_NAME,tt::CurrentThread::t_threadName);

	/*		try{
				m_func();
				tt::CurrentThread::t_threadName = "finish";
			}catch (const Exception& ex){
*/
			m_func();
			tt::CurrentThread::t_threadName = "finish";
		}